

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_subtract_sse2.c
# Opt level: O0

void subtract_4x8(int16_t *diff,ptrdiff_t diff_stride,uint16_t *src,ptrdiff_t src_stride,
                 uint16_t *pred,ptrdiff_t pred_stride)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  long in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  undefined8 *in_R8;
  long in_R9;
  __m128i x0;
  __m128i v7;
  __m128i v6;
  __m128i v5;
  __m128i v4;
  __m128i v3;
  __m128i v2;
  __m128i v1;
  __m128i v0;
  __m128i u7;
  __m128i u6;
  __m128i u5;
  __m128i u4;
  __m128i u3;
  __m128i u2;
  __m128i u1;
  __m128i u0;
  short local_1f8;
  short sStack_1f6;
  short sStack_1f4;
  short sStack_1f2;
  short local_1e8;
  short sStack_1e6;
  short sStack_1e4;
  short sStack_1e2;
  short local_1d8;
  short sStack_1d6;
  short sStack_1d4;
  short sStack_1d2;
  short local_1c8;
  short sStack_1c6;
  short sStack_1c4;
  short sStack_1c2;
  short local_1b8;
  short sStack_1b6;
  short sStack_1b4;
  short sStack_1b2;
  short local_1a8;
  short sStack_1a6;
  short sStack_1a4;
  short sStack_1a2;
  short local_198;
  short sStack_196;
  short sStack_194;
  short sStack_192;
  short local_188;
  short sStack_186;
  short sStack_184;
  short sStack_182;
  short local_178;
  short sStack_176;
  short sStack_174;
  short sStack_172;
  short local_168;
  short sStack_166;
  short sStack_164;
  short sStack_162;
  short local_158;
  short sStack_156;
  short sStack_154;
  short sStack_152;
  short local_148;
  short sStack_146;
  short sStack_144;
  short sStack_142;
  short local_138;
  short sStack_136;
  short sStack_134;
  short sStack_132;
  short local_128;
  short sStack_126;
  short sStack_124;
  short sStack_122;
  short local_118;
  short sStack_116;
  short sStack_114;
  short sStack_112;
  short local_108;
  short sStack_106;
  short sStack_104;
  short sStack_102;
  int64_t *store_diff;
  __m128i x7;
  __m128i x6;
  __m128i x5;
  __m128i x4;
  __m128i x3;
  __m128i x2;
  __m128i x1;
  
  uVar1 = *in_RDX;
  uVar2 = *(undefined8 *)((long)in_RDX + in_RCX * 2);
  uVar3 = *(undefined8 *)((long)in_RDX + in_RCX * 4);
  uVar4 = *(undefined8 *)((long)in_RDX + in_RCX * 6);
  uVar5 = in_RDX[in_RCX];
  uVar6 = *(undefined8 *)((long)in_RDX + in_RCX * 10);
  uVar7 = *(undefined8 *)((long)in_RDX + in_RCX * 0xc);
  uVar8 = *(undefined8 *)((long)in_RDX + in_RCX * 0xe);
  uVar9 = *in_R8;
  uVar10 = *(undefined8 *)((long)in_R8 + in_R9 * 2);
  uVar11 = *(undefined8 *)((long)in_R8 + in_R9 * 4);
  uVar12 = *(undefined8 *)((long)in_R8 + in_R9 * 6);
  uVar13 = in_R8[in_R9];
  uVar14 = *(undefined8 *)((long)in_R8 + in_R9 * 10);
  uVar15 = *(undefined8 *)((long)in_R8 + in_R9 * 0xc);
  uVar16 = *(undefined8 *)((long)in_R8 + in_R9 * 0xe);
  local_108 = (short)uVar1;
  sStack_106 = (short)((ulong)uVar1 >> 0x10);
  sStack_104 = (short)((ulong)uVar1 >> 0x20);
  sStack_102 = (short)((ulong)uVar1 >> 0x30);
  local_118 = (short)uVar9;
  sStack_116 = (short)((ulong)uVar9 >> 0x10);
  sStack_114 = (short)((ulong)uVar9 >> 0x20);
  sStack_112 = (short)((ulong)uVar9 >> 0x30);
  local_128 = (short)uVar2;
  sStack_126 = (short)((ulong)uVar2 >> 0x10);
  sStack_124 = (short)((ulong)uVar2 >> 0x20);
  sStack_122 = (short)((ulong)uVar2 >> 0x30);
  local_138 = (short)uVar10;
  sStack_136 = (short)((ulong)uVar10 >> 0x10);
  sStack_134 = (short)((ulong)uVar10 >> 0x20);
  sStack_132 = (short)((ulong)uVar10 >> 0x30);
  local_148 = (short)uVar3;
  sStack_146 = (short)((ulong)uVar3 >> 0x10);
  sStack_144 = (short)((ulong)uVar3 >> 0x20);
  sStack_142 = (short)((ulong)uVar3 >> 0x30);
  local_158 = (short)uVar11;
  sStack_156 = (short)((ulong)uVar11 >> 0x10);
  sStack_154 = (short)((ulong)uVar11 >> 0x20);
  sStack_152 = (short)((ulong)uVar11 >> 0x30);
  local_168 = (short)uVar4;
  sStack_166 = (short)((ulong)uVar4 >> 0x10);
  sStack_164 = (short)((ulong)uVar4 >> 0x20);
  sStack_162 = (short)((ulong)uVar4 >> 0x30);
  local_178 = (short)uVar12;
  sStack_176 = (short)((ulong)uVar12 >> 0x10);
  sStack_174 = (short)((ulong)uVar12 >> 0x20);
  sStack_172 = (short)((ulong)uVar12 >> 0x30);
  local_188 = (short)uVar5;
  sStack_186 = (short)((ulong)uVar5 >> 0x10);
  sStack_184 = (short)((ulong)uVar5 >> 0x20);
  sStack_182 = (short)((ulong)uVar5 >> 0x30);
  local_198 = (short)uVar13;
  sStack_196 = (short)((ulong)uVar13 >> 0x10);
  sStack_194 = (short)((ulong)uVar13 >> 0x20);
  sStack_192 = (short)((ulong)uVar13 >> 0x30);
  local_1a8 = (short)uVar6;
  sStack_1a6 = (short)((ulong)uVar6 >> 0x10);
  sStack_1a4 = (short)((ulong)uVar6 >> 0x20);
  sStack_1a2 = (short)((ulong)uVar6 >> 0x30);
  local_1b8 = (short)uVar14;
  sStack_1b6 = (short)((ulong)uVar14 >> 0x10);
  sStack_1b4 = (short)((ulong)uVar14 >> 0x20);
  sStack_1b2 = (short)((ulong)uVar14 >> 0x30);
  local_1c8 = (short)uVar7;
  sStack_1c6 = (short)((ulong)uVar7 >> 0x10);
  sStack_1c4 = (short)((ulong)uVar7 >> 0x20);
  sStack_1c2 = (short)((ulong)uVar7 >> 0x30);
  local_1d8 = (short)uVar15;
  sStack_1d6 = (short)((ulong)uVar15 >> 0x10);
  sStack_1d4 = (short)((ulong)uVar15 >> 0x20);
  sStack_1d2 = (short)((ulong)uVar15 >> 0x30);
  local_1e8 = (short)uVar8;
  sStack_1e6 = (short)((ulong)uVar8 >> 0x10);
  sStack_1e4 = (short)((ulong)uVar8 >> 0x20);
  sStack_1e2 = (short)((ulong)uVar8 >> 0x30);
  local_1f8 = (short)uVar16;
  sStack_1f6 = (short)((ulong)uVar16 >> 0x10);
  sStack_1f4 = (short)((ulong)uVar16 >> 0x20);
  sStack_1f2 = (short)((ulong)uVar16 >> 0x30);
  *in_RDI = CONCAT26(sStack_102 - sStack_112,
                     CONCAT24(sStack_104 - sStack_114,
                              CONCAT22(sStack_106 - sStack_116,local_108 - local_118)));
  *(ulong *)((long)in_RDI + in_RSI * 2) =
       CONCAT26(sStack_122 - sStack_132,
                CONCAT24(sStack_124 - sStack_134,
                         CONCAT22(sStack_126 - sStack_136,local_128 - local_138)));
  *(ulong *)((long)in_RDI + in_RSI * 4) =
       CONCAT26(sStack_142 - sStack_152,
                CONCAT24(sStack_144 - sStack_154,
                         CONCAT22(sStack_146 - sStack_156,local_148 - local_158)));
  *(ulong *)((long)in_RDI + in_RSI * 6) =
       CONCAT26(sStack_162 - sStack_172,
                CONCAT24(sStack_164 - sStack_174,
                         CONCAT22(sStack_166 - sStack_176,local_168 - local_178)));
  in_RDI[in_RSI] =
       CONCAT26(sStack_182 - sStack_192,
                CONCAT24(sStack_184 - sStack_194,
                         CONCAT22(sStack_186 - sStack_196,local_188 - local_198)));
  *(ulong *)((long)in_RDI + in_RSI * 10) =
       CONCAT26(sStack_1a2 - sStack_1b2,
                CONCAT24(sStack_1a4 - sStack_1b4,
                         CONCAT22(sStack_1a6 - sStack_1b6,local_1a8 - local_1b8)));
  *(ulong *)((long)in_RDI + in_RSI * 0xc) =
       CONCAT26(sStack_1c2 - sStack_1d2,
                CONCAT24(sStack_1c4 - sStack_1d4,
                         CONCAT22(sStack_1c6 - sStack_1d6,local_1c8 - local_1d8)));
  *(ulong *)((long)in_RDI + in_RSI * 0xe) =
       CONCAT26(sStack_1e2 - sStack_1f2,
                CONCAT24(sStack_1e4 - sStack_1f4,
                         CONCAT22(sStack_1e6 - sStack_1f6,local_1e8 - local_1f8)));
  return;
}

Assistant:

static void subtract_4x8(int16_t *diff, ptrdiff_t diff_stride,
                         const uint16_t *src, ptrdiff_t src_stride,
                         const uint16_t *pred, ptrdiff_t pred_stride) {
  __m128i u0, u1, u2, u3, u4, u5, u6, u7;
  __m128i v0, v1, v2, v3, v4, v5, v6, v7;
  __m128i x0, x1, x2, x3, x4, x5, x6, x7;
  int64_t *store_diff = (int64_t *)(diff + 0 * diff_stride);

  u0 = _mm_loadl_epi64((__m128i const *)(src + 0 * src_stride));
  u1 = _mm_loadl_epi64((__m128i const *)(src + 1 * src_stride));
  u2 = _mm_loadl_epi64((__m128i const *)(src + 2 * src_stride));
  u3 = _mm_loadl_epi64((__m128i const *)(src + 3 * src_stride));
  u4 = _mm_loadl_epi64((__m128i const *)(src + 4 * src_stride));
  u5 = _mm_loadl_epi64((__m128i const *)(src + 5 * src_stride));
  u6 = _mm_loadl_epi64((__m128i const *)(src + 6 * src_stride));
  u7 = _mm_loadl_epi64((__m128i const *)(src + 7 * src_stride));

  v0 = _mm_loadl_epi64((__m128i const *)(pred + 0 * pred_stride));
  v1 = _mm_loadl_epi64((__m128i const *)(pred + 1 * pred_stride));
  v2 = _mm_loadl_epi64((__m128i const *)(pred + 2 * pred_stride));
  v3 = _mm_loadl_epi64((__m128i const *)(pred + 3 * pred_stride));
  v4 = _mm_loadl_epi64((__m128i const *)(pred + 4 * pred_stride));
  v5 = _mm_loadl_epi64((__m128i const *)(pred + 5 * pred_stride));
  v6 = _mm_loadl_epi64((__m128i const *)(pred + 6 * pred_stride));
  v7 = _mm_loadl_epi64((__m128i const *)(pred + 7 * pred_stride));

  x0 = _mm_sub_epi16(u0, v0);
  x1 = _mm_sub_epi16(u1, v1);
  x2 = _mm_sub_epi16(u2, v2);
  x3 = _mm_sub_epi16(u3, v3);
  x4 = _mm_sub_epi16(u4, v4);
  x5 = _mm_sub_epi16(u5, v5);
  x6 = _mm_sub_epi16(u6, v6);
  x7 = _mm_sub_epi16(u7, v7);

  _mm_storel_epi64((__m128i *)store_diff, x0);
  store_diff = (int64_t *)(diff + 1 * diff_stride);
  _mm_storel_epi64((__m128i *)store_diff, x1);
  store_diff = (int64_t *)(diff + 2 * diff_stride);
  _mm_storel_epi64((__m128i *)store_diff, x2);
  store_diff = (int64_t *)(diff + 3 * diff_stride);
  _mm_storel_epi64((__m128i *)store_diff, x3);
  store_diff = (int64_t *)(diff + 4 * diff_stride);
  _mm_storel_epi64((__m128i *)store_diff, x4);
  store_diff = (int64_t *)(diff + 5 * diff_stride);
  _mm_storel_epi64((__m128i *)store_diff, x5);
  store_diff = (int64_t *)(diff + 6 * diff_stride);
  _mm_storel_epi64((__m128i *)store_diff, x6);
  store_diff = (int64_t *)(diff + 7 * diff_stride);
  _mm_storel_epi64((__m128i *)store_diff, x7);
}